

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O0

int CmpNode(void *p,void *va,void *vb)

{
  int iVar1;
  long local_50;
  nodeclass *cb;
  nodeclass *ca;
  node **b;
  node **a;
  void *vb_local;
  void *va_local;
  void *p_local;
  long local_10;
  
  local_10 = *va;
  cb = (nodeclass *)(*(long *)(local_10 + 8) + -0x48);
  p_local = *vb;
  local_50 = *(long *)((long)p_local + 8) + -0x48;
  ca = (nodeclass *)vb;
  b = (node **)va;
  a = (node **)vb;
  vb_local = va;
  va_local = p;
  iVar1 = CmpClass(p,&cb,&local_50);
  return iVar1;
}

Assistant:

static NOINLINE int CmpNode(const void* p, const void* va, const void* vb)
{
    const node* const* a = va;
    const node* const* b = vb;
    const nodeclass* ca = NodeGetClass(*a);
    const nodeclass* cb = NodeGetClass(*b);
    return CmpClass(p,&ca,&cb);
}